

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

double openjtalk_getAdditionalHalfTone(OpenJTalk *oj)

{
  undefined8 *in_RDI;
  double dVar1;
  double res;
  _Bool error;
  _Bool local_11;
  undefined8 *local_10;
  double local_8;
  
  if (in_RDI == (undefined8 *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    local_8 = 0.0;
  }
  else {
    *(undefined4 *)(in_RDI + 0xcf) = 0;
    local_10 = in_RDI;
    dVar1 = Open_JTalk_get_additional_half_tone((Open_JTalk *)*in_RDI,&local_11);
    if ((local_11 & 1U) == 0) {
      local_10[0xcc] = dVar1;
      local_8 = (double)local_10[0xcc];
    }
    else {
      *(undefined4 *)(local_10 + 0xcf) = 1;
      local_8 = 0.0;
    }
  }
  return local_8;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_getAdditionalHalfTone(OpenJTalk *oj)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return 0.0;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	bool error;
	double res = Open_JTalk_get_additional_half_tone(oj->open_jtalk, &error);
	if (error)
	{
		oj->errorCode = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return 0.0;
	}
	oj->additional_half_tone = res;
	return oj->additional_half_tone;
}